

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5StorageRebuild(Fts5Storage *p)

{
  Fts5Config *pConfig_00;
  int iVar1;
  sqlite3_int64 iRowid_00;
  uchar *pText;
  bool bVar2;
  i64 iRowid;
  int rc2;
  int rc;
  Fts5InsertCtx ctx;
  sqlite3_stmt *pScan;
  Fts5Config *pConfig;
  Fts5Buffer buf;
  Fts5Storage *p_local;
  
  buf._8_8_ = p;
  memset(&pConfig,0,0x10);
  pConfig_00 = *(Fts5Config **)buf._8_8_;
  ctx.iCol = 0;
  ctx.szCol = 0;
  memset(&rc2,0,0x10);
  rc2 = buf.n;
  rc = buf.nSpace;
  iRowid._4_4_ = sqlite3Fts5StorageDeleteAll((Fts5Storage *)buf._8_8_);
  if (iRowid._4_4_ == 0) {
    iRowid._4_4_ = fts5StorageLoadTotals((Fts5Storage *)buf._8_8_,1);
  }
  if (iRowid._4_4_ == 0) {
    iRowid._4_4_ = fts5StorageGetStmt((Fts5Storage *)buf._8_8_,10,(sqlite3_stmt **)&ctx.iCol,
                                      (char **)0x0);
  }
  while( true ) {
    bVar2 = false;
    if (iRowid._4_4_ == 0) {
      iVar1 = sqlite3_step((sqlite3_stmt *)ctx._8_8_);
      bVar2 = iVar1 == 100;
    }
    if (!bVar2) break;
    iRowid_00 = sqlite3_column_int64((sqlite3_stmt *)ctx._8_8_,0);
    sqlite3Fts5BufferZero((Fts5Buffer *)&pConfig);
    iRowid._4_4_ = sqlite3Fts5IndexBeginWrite(*(Fts5Index **)(buf._8_8_ + 8),0,iRowid_00);
    ctx.pStorage._0_4_ = 0;
    while( true ) {
      bVar2 = false;
      if (iRowid._4_4_ == 0) {
        bVar2 = (int)ctx.pStorage < pConfig_00->nCol;
      }
      if (!bVar2) break;
      ctx.pStorage._4_4_ = 0;
      if (pConfig_00->abUnindexed[(int)ctx.pStorage] == '\0') {
        pText = sqlite3_column_text((sqlite3_stmt *)ctx._8_8_,(int)ctx.pStorage + 1);
        iVar1 = sqlite3_column_bytes((sqlite3_stmt *)ctx._8_8_,(int)ctx.pStorage + 1);
        iRowid._4_4_ = sqlite3Fts5Tokenize(pConfig_00,4,(char *)pText,iVar1,&rc2,
                                           fts5StorageInsertCallback);
      }
      sqlite3Fts5BufferAppendVarint
                ((int *)((long)&iRowid + 4),(Fts5Buffer *)&pConfig,(long)ctx.pStorage._4_4_);
      *(long *)(*(long *)(buf._8_8_ + 0x20) + (long)(int)ctx.pStorage * 8) =
           (long)ctx.pStorage._4_4_ +
           *(long *)(*(long *)(buf._8_8_ + 0x20) + (long)(int)ctx.pStorage * 8);
      ctx.pStorage._0_4_ = (int)ctx.pStorage + 1;
    }
    *(long *)(buf._8_8_ + 0x18) = *(long *)(buf._8_8_ + 0x18) + 1;
    if (iRowid._4_4_ == 0) {
      iRowid._4_4_ = fts5StorageInsertDocsize
                               ((Fts5Storage *)buf._8_8_,iRowid_00,(Fts5Buffer *)&pConfig);
    }
  }
  sqlite3_free(pConfig);
  iRowid._0_4_ = sqlite3_reset((sqlite3_stmt *)ctx._8_8_);
  if (iRowid._4_4_ == 0) {
    iRowid._4_4_ = (int)iRowid;
  }
  if (iRowid._4_4_ == 0) {
    iRowid._4_4_ = fts5StorageSaveTotals((Fts5Storage *)buf._8_8_);
  }
  return iRowid._4_4_;
}

Assistant:

static int sqlite3Fts5StorageRebuild(Fts5Storage *p){
  Fts5Buffer buf = {0,0,0};
  Fts5Config *pConfig = p->pConfig;
  sqlite3_stmt *pScan = 0;
  Fts5InsertCtx ctx;
  int rc, rc2;

  memset(&ctx, 0, sizeof(Fts5InsertCtx));
  ctx.pStorage = p;
  rc = sqlite3Fts5StorageDeleteAll(p);
  if( rc==SQLITE_OK ){
    rc = fts5StorageLoadTotals(p, 1);
  }

  if( rc==SQLITE_OK ){
    rc = fts5StorageGetStmt(p, FTS5_STMT_SCAN, &pScan, 0);
  }

  while( rc==SQLITE_OK && SQLITE_ROW==sqlite3_step(pScan) ){
    i64 iRowid = sqlite3_column_int64(pScan, 0);

    sqlite3Fts5BufferZero(&buf);
    rc = sqlite3Fts5IndexBeginWrite(p->pIndex, 0, iRowid);
    for(ctx.iCol=0; rc==SQLITE_OK && ctx.iCol<pConfig->nCol; ctx.iCol++){
      ctx.szCol = 0;
      if( pConfig->abUnindexed[ctx.iCol]==0 ){
        rc = sqlite3Fts5Tokenize(pConfig, 
            FTS5_TOKENIZE_DOCUMENT,
            (const char*)sqlite3_column_text(pScan, ctx.iCol+1),
            sqlite3_column_bytes(pScan, ctx.iCol+1),
            (void*)&ctx,
            fts5StorageInsertCallback
        );
      }
      sqlite3Fts5BufferAppendVarint(&rc, &buf, ctx.szCol);
      p->aTotalSize[ctx.iCol] += (i64)ctx.szCol;
    }
    p->nTotalRow++;

    if( rc==SQLITE_OK ){
      rc = fts5StorageInsertDocsize(p, iRowid, &buf);
    }
  }
  sqlite3_free(buf.p);
  rc2 = sqlite3_reset(pScan);
  if( rc==SQLITE_OK ) rc = rc2;

  /* Write the averages record */
  if( rc==SQLITE_OK ){
    rc = fts5StorageSaveTotals(p);
  }
  return rc;
}